

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,char *stampDir)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  string line;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar2 = false;
  while( true ) {
    bVar4 = bVar2;
    bVar2 = cmsys::SystemTools::GetLineFromStream(fin,&local_50,(bool *)0x0,-1);
    if (!bVar2) break;
    bVar2 = bVar4;
    if (local_50._M_string_length != 0) {
      cVar1 = *local_50._M_dataplus._M_p;
      if ((cVar1 != '\r') && (cVar1 != '#')) {
        if (cVar1 == ' ') {
          bVar2 = false;
          if (bVar4) {
            ConsiderModule(this,local_50._M_dataplus._M_p + 1,stampDir);
            bVar2 = true;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          bVar2 = iVar3 == 0;
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const char* stampDir)
{
  std::string line;
  bool doing_provides = false;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Ignore comments and empty lines.
    if (line.empty() || line[0] == '#' || line[0] == '\r') {
      continue;
    }

    if (line[0] == ' ') {
      if (doing_provides) {
        this->ConsiderModule(line.c_str() + 1, stampDir);
      }
    } else if (line == "provides") {
      doing_provides = true;
    } else {
      doing_provides = false;
    }
  }
}